

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-input.c
# Opt level: O1

wchar_t get_effect_from_list(char *prompt,effect *effect,wchar_t count,_Bool allow_random)

{
  wchar_t wVar1;
  
  if (get_effect_from_list_hook != (_func_wchar_t_char_ptr_effect_ptr_wchar_t__Bool *)0x0) {
    wVar1 = (*get_effect_from_list_hook)(prompt,effect,count,allow_random);
    return wVar1;
  }
  return ~(uint)allow_random;
}

Assistant:

int get_effect_from_list(const char *prompt, struct effect *effect, int count,
	bool allow_random)
{
	/* Ask the UI for it */
	if (get_effect_from_list_hook) {
		return get_effect_from_list_hook(prompt, effect, count,
			allow_random);
	}
	/*
	 * If there's no UI implementation but a random selection is allowed,
	 * use that.
	 */
	return (allow_random) ? -2 : -1;
}